

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t c)

{
  ulong uVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  size_t local_28;
  size_t newSize;
  unsigned_long minElementsAllowed;
  size_t c_local;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  minElementsAllowed = c;
  c_local = (size_t)this;
  puVar2 = std::max<unsigned_long>(&minElementsAllowed,&this->mNumElements);
  uVar1 = *puVar2;
  for (local_28 = 8; sVar3 = calcMaxNumElementsAllowed(this,local_28),
      sVar3 < uVar1 && local_28 != 0; local_28 = local_28 << 1) {
  }
  if (local_28 == 0) {
    throwOverflowError(this);
  }
  rehashPowerOfTwo(this,local_28);
  return;
}

Assistant:

void reserve(size_t c) {
        ROBIN_HOOD_TRACE(this)
        auto const minElementsAllowed = (std::max)(c, mNumElements);
        auto newSize = InitialNumElements;
        while (calcMaxNumElementsAllowed(newSize) < minElementsAllowed && newSize != 0) {
            newSize *= 2;
        }
        if (ROBIN_HOOD_UNLIKELY(newSize == 0)) {
            throwOverflowError();
        }

        rehashPowerOfTwo(newSize);
    }